

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O2

void __thiscall
t_go_generator::generate_countsetfields_helper
          (t_go_generator *this,ostream *out,t_struct *tstruct,string *tstruct_name,bool is_result)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  t_type *ptVar5;
  pointer pptVar6;
  string field_name;
  string escaped_tstruct_name;
  string sStack_98;
  t_struct *local_78;
  string local_70;
  string local_50 [32];
  
  local_78 = tstruct;
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  (*(this->super_t_generator)._vptr_t_generator[3])(local_50,this,CONCAT44(extraout_var,iVar3));
  t_generator::indent_abi_cxx11_(&sStack_98,&this->super_t_generator);
  poVar4 = std::operator<<(out,(string *)&sStack_98);
  poVar4 = std::operator<<(poVar4,"func (p *");
  poVar4 = std::operator<<(poVar4,(string *)tstruct_name);
  poVar4 = std::operator<<(poVar4,") CountSetFields");
  poVar4 = std::operator<<(poVar4,(string *)tstruct_name);
  poVar4 = std::operator<<(poVar4,"() int {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_98);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&sStack_98,&this->super_t_generator);
  poVar4 = std::operator<<(out,(string *)&sStack_98);
  poVar4 = std::operator<<(poVar4,"count := 0");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_98);
  pptVar6 = (local_78->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (pptVar6 ==
        (local_78->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      t_generator::indent_abi_cxx11_(&sStack_98,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&sStack_98);
      poVar4 = std::operator<<(poVar4,"return count");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&sStack_98);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&sStack_98,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&sStack_98);
      poVar4 = std::operator<<(poVar4,"}");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&sStack_98);
      std::__cxx11::string::~string(local_50);
      return;
    }
    if ((*pptVar6)->req_ != T_REQUIRED) {
      ptVar5 = t_type::get_true_type((*pptVar6)->type_);
      bVar2 = is_pointer_field(*pptVar6,false);
      if (!bVar2) {
        iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[0x10])(ptVar5);
        if ((char)iVar3 == '\0') {
          iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[0xf])(ptVar5);
          if ((char)iVar3 == '\0') {
            iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[0xe])(ptVar5);
            if ((char)iVar3 == '\0') {
              iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[7])(ptVar5);
              if ((char)iVar3 == '\0') goto LAB_001c2bea;
            }
          }
        }
      }
      (*(this->super_t_generator)._vptr_t_generator[3])(&local_70,this,&(*pptVar6)->name_);
      publicize(&sStack_98,this,&local_70,false);
      std::__cxx11::string::~string((string *)&local_70);
      t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&local_70);
      poVar4 = std::operator<<(poVar4,"if (p.IsSet");
      poVar4 = std::operator<<(poVar4,(string *)&sStack_98);
      poVar4 = std::operator<<(poVar4,"()) {");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_70);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&local_70);
      poVar4 = std::operator<<(poVar4,"count++");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_70);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&local_70);
      poVar4 = std::operator<<(poVar4,"}");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&sStack_98);
    }
LAB_001c2bea:
    pptVar6 = pptVar6 + 1;
  } while( true );
}

Assistant:

void t_go_generator::generate_countsetfields_helper(ostream& out,
                                                    t_struct* tstruct,
                                                    const string& tstruct_name,
                                                    bool is_result) {
  (void)is_result;
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  const string escaped_tstruct_name(escape_string(tstruct->get_name()));

  out << indent() << "func (p *" << tstruct_name << ") CountSetFields" << tstruct_name << "() int {"
      << endl;
  indent_up();
  out << indent() << "count := 0" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED)
      continue;

    t_type* type = (*f_iter)->get_type()->get_true_type();

    if (!(is_pointer_field(*f_iter) || type->is_map() || type->is_set() || type->is_list() || type->is_binary()))
      continue;

    const string field_name(publicize(escape_string((*f_iter)->get_name())));

    out << indent() << "if (p.IsSet" << field_name << "()) {" << endl;
    indent_up();
    out << indent() << "count++" << endl;
    indent_down();
    out << indent() << "}" << endl;
  }

  out << indent() << "return count" << endl << endl;
  indent_down();
  out << indent() << "}" << endl << endl;
}